

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.cpp
# Opt level: O3

bool __thiscall
Rml::DataViews::Update(DataViews *this,DataModel *model,DirtyVariables *dirty_variables)

{
  NameViewMap *this_00;
  int iVar1;
  pointer puVar2;
  DataView *pDVar3;
  DataView *pDVar4;
  ObserverPtrBlock *pOVar5;
  code *pcVar6;
  iterator iVar7;
  DataModel *pDVar8;
  iterator iVar9;
  DataModel *pDVar10;
  bool bVar11;
  int iVar12;
  ulong uVar13;
  DataView **ppDVar14;
  DataView **ppDVar15;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
  _Var16;
  iterator __begin3;
  pointer pbVar17;
  long lVar18;
  pointer puVar19;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>
  it;
  DataView **ppDVar20;
  uint uVar21;
  long lVar22;
  String *variable_name_1;
  pointer __k;
  DataView **ppDVar23;
  String *variable_name;
  _Head_base<0UL,_Rml::DataView_*,_false> _Var24;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>_>
  pVar25;
  Vector<DataView_*> dirty_views;
  DataView **local_a8;
  iterator iStack_a0;
  DataView **local_98;
  DirtyVariables *local_90;
  undefined8 local_88;
  DataViewList *local_80;
  DataViewList *local_78;
  DataModel *local_70;
  pointer local_68;
  pointer local_60;
  ulong local_58;
  _Head_base<0UL,_Rml::DataView_*,_false> local_50;
  _Head_base<0UL,_Rml::DataView_*,_false> local_48;
  DataView *local_40;
  
  local_80 = &this->views_to_add;
  this_00 = &this->name_view_map;
  local_78 = &this->views_to_remove;
  local_58 = 0;
  lVar22 = 0;
  local_88 = 0;
  local_90 = dirty_variables;
  local_70 = model;
  do {
    puVar19 = (this->views_to_add).
              super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->views_to_add).
             super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar21 = (uint)local_58;
    if (uVar21 != 0) {
      if (puVar19 == puVar2) {
        if ((9 < uVar21) ||
           (lVar22 == (long)(local_90->m_container).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_90->m_container).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5)) goto LAB_00200e71;
      }
      else if (9 < uVar21) {
LAB_00200e71:
        return (bool)((byte)local_88 & 1);
      }
    }
    __k = (local_90->m_container).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pbVar17 = (local_90->m_container).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_a8 = (DataView **)0x0;
    iStack_a0._M_current = (DataView **)0x0;
    local_98 = (DataView **)0x0;
    local_68 = __k;
    local_60 = pbVar17;
    if (puVar19 != puVar2) {
      ::std::
      vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
      ::reserve(&this->views,
                ((long)puVar2 - (long)puVar19 >> 3) +
                ((long)(this->views).
                       super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->views).
                       super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3));
      puVar19 = (this->views_to_add).
                super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (this->views_to_add).
               super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar19 != puVar2) {
        do {
          local_48._M_head_impl =
               (puVar19->_M_t).super___uniq_ptr_impl<Rml::DataView,_Rml::Releaser<Rml::DataView>_>.
               _M_t.super__Tuple_impl<0UL,_Rml::DataView_*,_Rml::Releaser<Rml::DataView>_>.
               super__Head_base<0UL,_Rml::DataView_*,_false>._M_head_impl;
          ::std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>::emplace_back<Rml::DataView*>
                    ((vector<Rml::DataView*,std::allocator<Rml::DataView*>> *)&local_a8,
                     &local_48._M_head_impl);
          (*(((puVar19->_M_t).super___uniq_ptr_impl<Rml::DataView,_Rml::Releaser<Rml::DataView>_>.
              _M_t.super__Tuple_impl<0UL,_Rml::DataView_*,_Rml::Releaser<Rml::DataView>_>.
              super__Head_base<0UL,_Rml::DataView_*,_false>._M_head_impl)->super_Releasable).
            _vptr_Releasable[5])(&local_48);
          pDVar4 = local_40;
          for (_Var24._M_head_impl = local_48._M_head_impl; _Var24._M_head_impl != pDVar4;
              _Var24._M_head_impl = (DataView *)&_Var24._M_head_impl[1].attached_element) {
            local_50._M_head_impl =
                 (puVar19->_M_t).super___uniq_ptr_impl<Rml::DataView,_Rml::Releaser<Rml::DataView>_>
                 ._M_t.super__Tuple_impl<0UL,_Rml::DataView_*,_Rml::Releaser<Rml::DataView>_>.
                 super__Head_base<0UL,_Rml::DataView_*,_false>._M_head_impl;
            ::std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Rml::DataView*>,std::allocator<std::pair<std::__cxx11::string_const,Rml::DataView*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
            ::_M_emplace<std::__cxx11::string_const&,Rml::DataView*>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Rml::DataView*>,std::allocator<std::pair<std::__cxx11::string_const,Rml::DataView*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                        *)this_00,0,_Var24._M_head_impl,&local_50);
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_48);
          ::std::
          vector<std::unique_ptr<Rml::DataView,Rml::Releaser<Rml::DataView>>,std::allocator<std::unique_ptr<Rml::DataView,Rml::Releaser<Rml::DataView>>>>
          ::emplace_back<std::unique_ptr<Rml::DataView,Rml::Releaser<Rml::DataView>>>
                    ((vector<std::unique_ptr<Rml::DataView,Rml::Releaser<Rml::DataView>>,std::allocator<std::unique_ptr<Rml::DataView,Rml::Releaser<Rml::DataView>>>>
                      *)this,puVar19);
          puVar19 = puVar19 + 1;
        } while (puVar19 != puVar2);
        puVar19 = (local_80->
                  super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      }
      ::std::
      vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
      ::_M_erase_at_end(local_80,puVar19);
      __k = (local_90->m_container).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      pbVar17 = (local_90->m_container).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; iVar7._M_current = iStack_a0._M_current, ppDVar20 = local_a8, __k != pbVar17;
        __k = __k + 1) {
      pVar25 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
               ::equal_range(&this_00->_M_h,__k);
      for (_Var16._M_cur =
                (__node_type *)
                pVar25.first.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
                ._M_cur;
          (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
           )_Var16._M_cur !=
          pVar25.second.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
          ._M_cur.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
          ; _Var16._M_cur = (__node_type *)((_Var16._M_cur)->super__Hash_node_base)._M_nxt) {
        ppDVar20 = (DataView **)
                   ((long)&((_Var16._M_cur)->
                           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>_>
                           ._M_storage._M_storage + 0x20);
        if (iStack_a0._M_current == local_98) {
          ::std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>::
          _M_realloc_insert<Rml::DataView*const&>
                    ((vector<Rml::DataView*,std::allocator<Rml::DataView*>> *)&local_a8,iStack_a0,
                     ppDVar20);
        }
        else {
          *iStack_a0._M_current = *ppDVar20;
          iStack_a0._M_current = iStack_a0._M_current + 1;
        }
      }
    }
    if (local_a8 != iStack_a0._M_current) {
      uVar13 = (long)iStack_a0._M_current - (long)local_a8 >> 3;
      lVar22 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar22 == 0; lVar22 = lVar22 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_a8,iStack_a0._M_current,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
      ::std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (ppDVar20,iVar7._M_current);
    }
    ppDVar20 = local_a8;
    if (local_a8 != iStack_a0._M_current) {
      ppDVar23 = local_a8 + 1;
      do {
        ppDVar14 = ppDVar23;
        if (ppDVar14 == iStack_a0._M_current) goto LAB_00200cfa;
        ppDVar23 = ppDVar14 + 1;
      } while (ppDVar14[-1] != *ppDVar14);
      ppDVar15 = ppDVar14 + -1;
      pDVar4 = ppDVar14[-1];
      for (; ppDVar23 != iStack_a0._M_current; ppDVar23 = ppDVar23 + 1) {
        pDVar3 = *ppDVar23;
        if (pDVar4 != pDVar3) {
          ppDVar15[1] = pDVar3;
          ppDVar15 = ppDVar15 + 1;
        }
        pDVar4 = pDVar3;
      }
      if (ppDVar15 + 1 != iStack_a0._M_current) {
        iStack_a0._M_current = ppDVar15 + 1;
      }
    }
LAB_00200cfa:
    iVar9._M_current = iStack_a0._M_current;
    iVar7._M_current = iStack_a0._M_current;
    pDVar8 = local_70;
    if (local_a8 != iStack_a0._M_current) {
      lVar18 = (long)iStack_a0._M_current - (long)local_a8;
      uVar13 = lVar18 >> 3;
      lVar22 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar22 == 0; lVar22 = lVar22 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Rml::DataViews::Update(Rml::DataModel&,itlib::flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)::__0>>
                (local_a8,iStack_a0._M_current,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar18 < 0x81) {
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Rml::DataViews::Update(Rml::DataModel&,itlib::flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)::__0>>
                  (ppDVar20,iVar9._M_current);
        ppDVar20 = local_a8;
        iVar7._M_current = iStack_a0._M_current;
        pDVar8 = local_70;
      }
      else {
        ppDVar23 = ppDVar20 + 0x10;
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Rml::DataViews::Update(Rml::DataModel&,itlib::flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)::__0>>
                  (ppDVar20,ppDVar23);
        for (; ppDVar20 = local_a8, iVar7._M_current = iStack_a0._M_current, pDVar8 = local_70,
            ppDVar23 != iVar9._M_current; ppDVar23 = ppDVar23 + 1) {
          pDVar4 = ppDVar23[-1];
          pDVar3 = *ppDVar23;
          iVar12 = pDVar3->sort_order;
          iVar1 = pDVar4->sort_order;
          ppDVar20 = ppDVar23;
          while (iVar12 < iVar1) {
            *ppDVar20 = pDVar4;
            pDVar4 = ppDVar20[-2];
            ppDVar20 = ppDVar20 + -1;
            iVar1 = pDVar4->sort_order;
          }
          *ppDVar20 = pDVar3;
        }
      }
    }
    for (; pDVar10 = local_70, iVar9._M_current = iStack_a0._M_current, local_70 = pDVar8,
        ppDVar20 != iStack_a0._M_current; ppDVar20 = ppDVar20 + 1) {
      pDVar4 = *ppDVar20;
      if (pDVar4 == (DataView *)0x0) {
        iStack_a0._M_current = iVar7._M_current;
        bVar11 = Assert("RMLUI_ASSERT(view)",
                        "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataView.cpp"
                        ,0x88);
        if (!bVar11) {
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
      }
      else {
        pOVar5 = (pDVar4->attached_element).block;
        iStack_a0._M_current = iVar7._M_current;
        if ((pOVar5 != (ObserverPtrBlock *)0x0) && (pOVar5->pointed_to_object != (void *)0x0)) {
          iVar12 = (*(pDVar4->super_Releasable)._vptr_Releasable[4])(pDVar4,pDVar10);
          local_88 = CONCAT71((int7)((ulong)local_88 >> 8),(byte)local_88 | (byte)iVar12);
        }
      }
      iVar7._M_current = iStack_a0._M_current;
      pDVar8 = local_70;
      local_70 = pDVar10;
      iStack_a0._M_current = iVar9._M_current;
    }
    puVar19 = (this->views_to_remove).
              super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->views_to_remove).
             super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iStack_a0._M_current = iVar7._M_current;
    if (puVar19 != puVar2) {
      do {
        _Var16._M_cur = (__node_type *)(this->name_view_map)._M_h._M_before_begin._M_nxt;
        while (_Var16._M_cur != (__node_type *)0x0) {
          if (*(DataView **)((long)_Var16._M_cur + 0x28) ==
              (puVar19->_M_t).super___uniq_ptr_impl<Rml::DataView,_Rml::Releaser<Rml::DataView>_>.
              _M_t.super__Tuple_impl<0UL,_Rml::DataView_*,_Rml::Releaser<Rml::DataView>_>.
              super__Head_base<0UL,_Rml::DataView_*,_false>._M_head_impl) {
            _Var16._M_cur =
                 (__node_type *)
                 ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                 ::erase(&this_00->_M_h,_Var16._M_cur);
          }
          else {
            _Var16._M_cur = *_Var16._M_cur;
          }
        }
        puVar19 = puVar19 + 1;
      } while (puVar19 != puVar2);
      ::std::
      vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
      ::_M_erase_at_end(local_78,(local_78->
                                 super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8 != (DataView **)0x0) {
      operator_delete(local_a8,(long)local_98 - (long)local_a8);
    }
    lVar22 = (long)local_60 - (long)local_68 >> 5;
    local_58 = (ulong)((int)local_58 + 1);
  } while( true );
}

Assistant:

bool DataViews::Update(DataModel& model, const DirtyVariables& dirty_variables)
{
	bool result = false;
	size_t num_dirty_variables_prev = 0;

	// View updates may result in newly added views, or even new dirty variables. Thus, we do the
	// update recursively but with an upper limit. Without the loop, newly added views won't be
	// updated until the next Update() call.
	for (int i = 0; (i == 0 || !views_to_add.empty() || num_dirty_variables_prev != dirty_variables.size()) && i < 10; i++)
	{
		num_dirty_variables_prev = dirty_variables.size();

		Vector<DataView*> dirty_views;

		if (!views_to_add.empty())
		{
			views.reserve(views.size() + views_to_add.size());
			for (auto&& view : views_to_add)
			{
				dirty_views.push_back(view.get());
				for (const String& variable_name : view->GetVariableNameList())
					name_view_map.emplace(variable_name, view.get());

				views.push_back(std::move(view));
			}
			views_to_add.clear();
		}

		for (const String& variable_name : dirty_variables)
		{
			auto pair = name_view_map.equal_range(variable_name);
			for (auto it = pair.first; it != pair.second; ++it)
				dirty_views.push_back(it->second);
		}

		// Remove duplicate entries
		std::sort(dirty_views.begin(), dirty_views.end());
		auto it_remove = std::unique(dirty_views.begin(), dirty_views.end());
		dirty_views.erase(it_remove, dirty_views.end());

		// Sort by the element's depth in the document tree so that any structural changes due to a changed variable are reflected in the element's
		// children. Eg. the 'data-for' view will remove children if any of its data variable array size is reduced.
		std::sort(dirty_views.begin(), dirty_views.end(), [](auto&& left, auto&& right) { return left->GetSortOrder() < right->GetSortOrder(); });

		for (DataView* view : dirty_views)
		{
			RMLUI_ASSERT(view);
			if (!view)
				continue;

			if (view->IsValid())
				result |= view->Update(model);
		}

		// Destroy views marked for destruction
		// @performance: Horrible...
		if (!views_to_remove.empty())
		{
			for (const auto& view : views_to_remove)
			{
				for (auto it = name_view_map.begin(); it != name_view_map.end();)
				{
					if (it->second == view.get())
						it = name_view_map.erase(it);
					else
						++it;
				}
			}

			views_to_remove.clear();
		}
	}

	return result;
}